

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

void sysbvm_type_setMethodWithSelector
               (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t selector,
               sysbvm_tuple_t method)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_bitflags_t sVar3;
  sysbvm_type_tuple_t *typeObject;
  sysbvm_tuple_t method_local;
  sysbvm_tuple_t selector_local;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(type);
  if (_Var1) {
    if (*(long *)(type + 0x90) == 0) {
      sVar2 = sysbvm_methodDictionary_create(context);
      *(sysbvm_tuple_t *)(type + 0x90) = sVar2;
    }
    sysbvm_methodDictionary_atPut(context,*(sysbvm_tuple_t *)(type + 0x90),selector,method);
    sysbvm_function_recordBindingWithOwnerAndName(context,method,type,selector);
    sVar3 = sysbvm_function_getFlags(context,method);
    if ((sVar3 & 0xe0) != 0) {
      if (*(long *)(type + 0xb8) == 0) {
        sVar2 = sysbvm_orderedCollection_create(context);
        *(sysbvm_tuple_t *)(type + 0xb8) = sVar2;
      }
      _Var1 = sysbvm_orderedCollection_identityIncludes(*(sysbvm_tuple_t *)(type + 0xb8),selector);
      if (!_Var1) {
        sysbvm_orderedCollection_add(context,*(sysbvm_tuple_t *)(type + 0xb8),selector);
      }
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_type_setMethodWithSelector(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t selector, sysbvm_tuple_t method)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return;

    sysbvm_type_tuple_t* typeObject = (sysbvm_type_tuple_t*)type;
    if(!typeObject->methodDictionary)
        typeObject->methodDictionary = sysbvm_methodDictionary_create(context);
    sysbvm_methodDictionary_atPut(context, typeObject->methodDictionary, selector, method);
    sysbvm_function_recordBindingWithOwnerAndName(context, method, type, selector);

    if((sysbvm_function_getFlags(context, method) & SYSBVM_FUNCTION_FLAGS_VIRTUAL_DISPATCH_FLAGS) != 0)
    {
        if(!typeObject->virtualMethodSelectorList)
            typeObject->virtualMethodSelectorList = sysbvm_orderedCollection_create(context);

        if(!sysbvm_orderedCollection_identityIncludes(typeObject->virtualMethodSelectorList, selector))
            sysbvm_orderedCollection_add(context, typeObject->virtualMethodSelectorList, selector);
    }
}